

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O0

MatExpr * imagestego::impl::HaarWavelet::inverseVerticalLifting(Mat *src)

{
  MatExpr *in_RDI;
  MatExpr *in_stack_fffffffffffffc78;
  Mat *in_stack_fffffffffffffcb8;
  Mat local_230 [96];
  Mat local_1d0 [464];
  
  cv::Mat::t();
  cv::MatExpr::operator_cast_to_Mat(in_stack_fffffffffffffc78);
  inverseHorizontalLifting(in_stack_fffffffffffffcb8);
  cv::Mat::t();
  cv::MatExpr::operator_cast_to_Mat(in_stack_fffffffffffffc78);
  cv::MatExpr::~MatExpr(in_RDI);
  cv::Mat::~Mat(local_1d0);
  cv::Mat::~Mat(local_230);
  cv::MatExpr::~MatExpr(in_RDI);
  return in_RDI;
}

Assistant:

static inline cv::Mat inverseVerticalLifting(const cv::Mat& src) {
        return inverseHorizontalLifting(src.t()).t();
    }